

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimplifyLocals.cpp
# Opt level: O0

void __thiscall
wasm::SimplifyLocals<false,_false,_false>::visitBlock
          (SimplifyLocals<false,_false,_false> *this,Block *curr)

{
  bool bVar1;
  mapped_type *this_00;
  size_type sVar2;
  size_type sVar3;
  bool bVar4;
  bool hasBreaks;
  Block *curr_local;
  SimplifyLocals<false,_false,_false> *this_local;
  
  bVar1 = IString::is(&(curr->name).super_IString);
  bVar4 = false;
  if (bVar1) {
    this_00 = std::
              map<wasm::Name,_std::vector<wasm::SimplifyLocals<false,_false,_false>::BlockBreak,_std::allocator<wasm::SimplifyLocals<false,_false,_false>::BlockBreak>_>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::vector<wasm::SimplifyLocals<false,_false,_false>::BlockBreak,_std::allocator<wasm::SimplifyLocals<false,_false,_false>::BlockBreak>_>_>_>_>
              ::operator[](&this->blockBreaks,&curr->name);
    sVar2 = std::
            vector<wasm::SimplifyLocals<false,_false,_false>::BlockBreak,_std::allocator<wasm::SimplifyLocals<false,_false,_false>::BlockBreak>_>
            ::size(this_00);
    bVar4 = sVar2 != 0;
  }
  bVar1 = IString::is(&(curr->name).super_IString);
  if (bVar1) {
    sVar3 = std::set<wasm::Name,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>::count
                      (&this->unoptimizableBlocks,&curr->name);
    if (sVar3 != 0) {
      std::
      map<unsigned_int,_wasm::SimplifyLocals<false,_false,_false>::SinkableInfo,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_wasm::SimplifyLocals<false,_false,_false>::SinkableInfo>_>_>
      ::clear(&this->sinkables);
      std::set<wasm::Name,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>::erase
                (&this->unoptimizableBlocks,&curr->name);
    }
    if (bVar4) {
      std::
      map<unsigned_int,_wasm::SimplifyLocals<false,_false,_false>::SinkableInfo,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_wasm::SimplifyLocals<false,_false,_false>::SinkableInfo>_>_>
      ::clear(&this->sinkables);
      std::
      map<wasm::Name,_std::vector<wasm::SimplifyLocals<false,_false,_false>::BlockBreak,_std::allocator<wasm::SimplifyLocals<false,_false,_false>::BlockBreak>_>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::vector<wasm::SimplifyLocals<false,_false,_false>::BlockBreak,_std::allocator<wasm::SimplifyLocals<false,_false,_false>::BlockBreak>_>_>_>_>
      ::erase(&this->blockBreaks,&curr->name);
    }
  }
  return;
}

Assistant:

void visitBlock(Block* curr) {
    bool hasBreaks = curr->name.is() && blockBreaks[curr->name].size() > 0;

    if (allowStructure) {
      optimizeBlockReturn(curr); // can modify blockBreaks
    }

    // post-block cleanups
    if (curr->name.is()) {
      if (unoptimizableBlocks.count(curr->name)) {
        sinkables.clear();
        unoptimizableBlocks.erase(curr->name);
      }

      if (hasBreaks) {
        // more than one path to here, so nonlinear
        sinkables.clear();
        blockBreaks.erase(curr->name);
      }
    }
  }